

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
multi_agent_planning::InteractionCostCalculator::getInteractingAgents
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,InteractionCostCalculator *this
          ,Edge edge,int time)

{
  iterator __position;
  mapped_type *pmVar1;
  _Head_base<0UL,_int,_false> *__args;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar1 = std::
           map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
           ::at(&this->interactionMap,&edge);
  __args = &(((pmVar1->
              super__Vector_base<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->
            super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>).
            super__Head_base<0UL,_int,_false>;
  do {
    if (__args[-2]._M_head_impl == time) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                   &__args->_M_head_impl);
      }
      else {
        *__position._M_current = __args->_M_head_impl;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    __args = __args + 0x10;
  } while( true );
}

Assistant:

vector<int> InteractionCostCalculator::getInteractingAgents(Edge edge, int time) const {
	vector<int> agents;

	try {
		const PlannedActionList& interactions = interactionMap.at(edge);

		for (auto const& i : interactions) {
			if (get<1>(i).start_time == time) {
				//cout << get<0>(i) << " " << get<1>(i).edge << endl;
				agents.push_back(get<0>(i));
			}
		}
	}
	catch (std::out_of_range) {
		return agents;
	}

}